

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O2

void __thiscall QPropertyAnimation::QPropertyAnimation(QPropertyAnimation *this,QObject *parent)

{
  QPropertyAnimationPrivate *this_00;
  
  this_00 = (QPropertyAnimationPrivate *)operator_new(0x188);
  QPropertyAnimationPrivate::QPropertyAnimationPrivate(this_00);
  QVariantAnimation::QVariantAnimation
            ((QVariantAnimation *)this,(QVariantAnimationPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_006685c8;
  return;
}

Assistant:

QPropertyAnimation::QPropertyAnimation(QObject *parent)
    : QVariantAnimation(*new QPropertyAnimationPrivate, parent)
{
}